

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene::MergePartialFromCodedStream
          (VisionFeaturePrint_Scene *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  bool bVar4;
  uint32 uVar5;
  uint tag;
  ulong uVar6;
  int value;
  int local_2c;
  
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00211976;
      input->buffer_ = pbVar2 + 1;
      uVar6 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00211976:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar6 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar6 = 0x100000000;
      }
      uVar6 = uVar5 | uVar6;
    }
    tag = (uint)uVar6;
    if (((uVar6 & 0x100000000) == 0) || ((char)uVar6 != '\b' || (tag & 0xfffffff8) != 8)) {
      bVar3 = (tag & 7) == 4 || tag == 0;
      if (bVar3) {
        return bVar3;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,tag);
      if (!bVar4) {
        return bVar3;
      }
    }
    else {
      bVar3 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                        (input,&local_2c);
      if (!bVar3) {
        return false;
      }
      this->version_ = local_2c;
    }
  } while( true );
}

Assistant:

bool VisionFeaturePrint_Scene::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene.SceneVersion version = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_version(static_cast< ::CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene_SceneVersion >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene)
  return false;
#undef DO_
}